

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O2

void recalculate_stats(int *stats_local_local,wchar_t points_left_local)

{
  int16_t iVar1;
  player *ppVar2;
  int *piVar3;
  long lVar4;
  
  ppVar2 = player;
  piVar3 = stats;
  for (lVar4 = 0; lVar4 != 5; lVar4 = lVar4 + 1) {
    iVar1 = (int16_t)*piVar3;
    ppVar2->stat_birth[lVar4] = iVar1;
    ppVar2->stat_max[lVar4] = iVar1;
    ppVar2->stat_cur[lVar4] = iVar1;
    ppVar2->stat_map[lVar4] = (int16_t)lVar4;
    piVar3 = piVar3 + 1;
  }
  ppVar2->au_birth = (int)stats_local_local * 0x32 + (uint)z_info->start_gold;
  get_bonuses();
  event_signal(EVENT_GOLD);
  event_signal(EVENT_AC);
  event_signal(EVENT_HP);
  event_signal(EVENT_STATS);
  return;
}

Assistant:

static void recalculate_stats(int *stats_local_local, int points_left_local)
{
	int i;

	/* Variable stat maxes */
	for (i = 0; i < STAT_MAX; i++) {
		player->stat_cur[i] = player->stat_max[i] =
				player->stat_birth[i] = stats_local_local[i];
		player->stat_map[i] = i;
	}

	/* Gold is inversely proportional to cost */
	player->au_birth = z_info->start_gold + (50 * points_left_local);

	/* Update bonuses, hp, etc. */
	get_bonuses();

	/* Tell the UI about all this stuff that's changed. */
	event_signal(EVENT_GOLD);
	event_signal(EVENT_AC);
	event_signal(EVENT_HP);
	event_signal(EVENT_STATS);
}